

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> * __thiscall
Assimp::Ogre::IVertexData::ReferencedBonesByWeights
          (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
           *__return_storage_ptr__,IVertexData *this)

{
  bool bVar1;
  reference pVVar2;
  VertexBoneAssignment *boneAssign;
  const_iterator __end2;
  const_iterator __begin2;
  VertexBoneAssignmentList *__range2;
  IVertexData *this_local;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *referenced;
  
  std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::set
            (__return_storage_ptr__);
  __end2 = std::
           vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
           ::begin(&this->boneAssignments);
  boneAssign = (VertexBoneAssignment *)
               std::
               vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               ::end(&this->boneAssignments);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                                     *)&boneAssign), bVar1) {
    pVVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
             ::operator*(&__end2);
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::insert
              (__return_storage_ptr__,&pVVar2->boneIndex);
    __gnu_cxx::
    __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint16_t> IVertexData::ReferencedBonesByWeights() const
{
    std::set<uint16_t> referenced;
    for (const auto &boneAssign : boneAssignments)
    {
        referenced.insert(boneAssign.boneIndex);
    }
    return referenced;
}